

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnGetValidate(XL *out,string *val_path)

{
  std::__cxx11::string::_M_assign((string *)val_path);
  return 0;
}

Assistant:

XL_DLL int XLearnGetValidate(XL *out, std::string& val_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  val_path = xl->GetHyperParam().validate_set_file;
  API_END();
}